

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::set_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration,uint32_t value)

{
  TypedID<(spirv_cross::Types)0> local_2c;
  mapped_type *local_28;
  Decoration *dec;
  ExtendedDecorations local_18;
  uint32_t value_local;
  ExtendedDecorations decoration_local;
  uint32_t id_local;
  Compiler *this_local;
  
  dec._4_4_ = value;
  local_18 = decoration;
  value_local = id;
  _decoration_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,id);
  local_28 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->ir).meta,&local_2c);
  Bitset::set(&(local_28->decoration).extended.flags,local_18);
  (local_28->decoration).extended.values[local_18] = dec._4_4_;
  return;
}

Assistant:

void Compiler::set_extended_decoration(uint32_t id, ExtendedDecorations decoration, uint32_t value)
{
	auto &dec = ir.meta[id].decoration;
	dec.extended.flags.set(decoration);
	dec.extended.values[decoration] = value;
}